

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

interval_t __thiscall
duckdb::Interpolator<false>::
Operation<duckdb::dtime_t,duckdb::interval_t,duckdb::MadAccessor<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t>>
          (Interpolator<false> *this,dtime_t *v_t,Vector *result,
          MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t> *accessor)

{
  idx_t iVar1;
  idx_t iVar2;
  idx_t iVar3;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>_>_>
  __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>_>_>
  __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>_>_>
  __comp_01;
  bool bVar4;
  ulong uVar5;
  OutOfRangeException *pOVar6;
  InvalidInputException *pIVar7;
  int64_t iVar8;
  long lVar9;
  long lVar10;
  interval_t iVar11;
  interval_t input;
  interval_t input_00;
  interval_t input_01;
  interval_t result_1;
  string local_78;
  interval_t local_58;
  interval_t local_48;
  
  bVar4 = this->desc;
  iVar1 = this->FRN;
  iVar2 = this->begin;
  iVar3 = this->end;
  local_78._M_dataplus._M_p = (pointer)accessor;
  local_78._M_string_length = (size_type)accessor;
  local_78.field_2._M_local_buf[0] = bVar4;
  if (this->CRN == iVar1) {
    if (iVar1 != iVar3 && iVar2 != iVar3) {
      uVar5 = (long)(iVar3 * 8 + iVar2 * -8) >> 3;
      lVar10 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_78.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar4;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      ::std::
      __introselect<duckdb::dtime_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t>>>>
                (v_t + iVar2,v_t + iVar1,v_t + iVar3,(ulong)(((uint)lVar10 ^ 0x3f) * 2) ^ 0x7e,
                 __comp);
    }
    lVar10 = v_t[this->FRN].micros - accessor->median->micros;
    if (lVar10 == -0x8000000000000000) {
      pOVar6 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"Overflow on abs(%d)","");
      OutOfRangeException::OutOfRangeException<long>(pOVar6,&local_78,-0x8000000000000000);
      __cxa_throw(pOVar6,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    lVar9 = -lVar10;
    if (0 < lVar10) {
      lVar9 = lVar10;
    }
    iVar11 = Interval::FromMicro(lVar9);
    input._0_8_ = iVar11.micros;
    iVar8 = 0;
    bVar4 = TryCast::Operation<duckdb::interval_t,duckdb::interval_t>(iVar11,&local_58,false);
    if (!bVar4) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input.micros = iVar8;
      CastExceptionText<duckdb::interval_t,duckdb::interval_t>(&local_78,iVar11._0_8_,input);
      InvalidInputException::InvalidInputException(pIVar7,&local_78);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar11.days = local_58.days;
    iVar11.months = local_58.months;
    iVar11.micros._0_4_ = (undefined4)local_58.micros;
    iVar11.micros._4_4_ = local_58.micros._4_4_;
  }
  else {
    if (iVar1 != iVar3 && iVar2 != iVar3) {
      uVar5 = (long)(iVar3 * 8 + iVar2 * -8) >> 3;
      lVar10 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_78.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar4;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      ::std::
      __introselect<duckdb::dtime_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t>>>>
                (v_t + iVar2,v_t + iVar1,v_t + iVar3,(ulong)(((uint)lVar10 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
    }
    iVar1 = this->FRN;
    iVar2 = this->end;
    local_78._M_dataplus._M_p = (pointer)accessor;
    local_78._M_string_length = (size_type)accessor;
    local_78.field_2._M_local_buf[0] = bVar4;
    if (this->CRN != iVar2 && iVar1 != iVar2) {
      uVar5 = (long)(iVar2 * 8 + iVar1 * -8) >> 3;
      lVar10 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_78.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar4;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      ::std::
      __introselect<duckdb::dtime_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t>>>>
                (v_t + iVar1,v_t + this->CRN,v_t + iVar2,(ulong)(((uint)lVar10 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
    }
    lVar10 = v_t[this->FRN].micros - accessor->median->micros;
    if (lVar10 == -0x8000000000000000) {
      pOVar6 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"Overflow on abs(%d)","");
      OutOfRangeException::OutOfRangeException<long>(pOVar6,&local_78,-0x8000000000000000);
      __cxa_throw(pOVar6,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    lVar9 = -lVar10;
    if (0 < lVar10) {
      lVar9 = lVar10;
    }
    iVar11 = Interval::FromMicro(lVar9);
    input_00._0_8_ = iVar11.micros;
    iVar8 = 0;
    bVar4 = TryCast::Operation<duckdb::interval_t,duckdb::interval_t>(iVar11,&local_58,false);
    if (!bVar4) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_00.micros = iVar8;
      CastExceptionText<duckdb::interval_t,duckdb::interval_t>(&local_78,iVar11._0_8_,input_00);
      InvalidInputException::InvalidInputException(pIVar7,&local_78);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_48.months = local_58.months;
    local_48.days = local_58.days;
    local_48.micros._0_4_ = (undefined4)local_58.micros;
    local_48.micros._4_4_ = local_58.micros._4_4_;
    lVar10 = v_t[this->CRN].micros - accessor->median->micros;
    if (lVar10 == -0x8000000000000000) {
      pOVar6 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"Overflow on abs(%d)","");
      OutOfRangeException::OutOfRangeException<long>(pOVar6,&local_78,-0x8000000000000000);
      __cxa_throw(pOVar6,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    lVar9 = -lVar10;
    if (0 < lVar10) {
      lVar9 = lVar10;
    }
    iVar11 = Interval::FromMicro(lVar9);
    input_01._0_8_ = iVar11.micros;
    iVar8 = 0;
    bVar4 = TryCast::Operation<duckdb::interval_t,duckdb::interval_t>(iVar11,&local_58,false);
    if (!bVar4) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_01.micros = iVar8;
      CastExceptionText<duckdb::interval_t,duckdb::interval_t>(&local_78,iVar11._0_8_,input_01);
      InvalidInputException::InvalidInputException(pIVar7,&local_78);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar11 = CastInterpolation::Interpolate<duckdb::interval_t>
                       (&local_48,
                        this->RN -
                        (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                         1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0)),
                        (interval_t *)&local_78);
  }
  return iVar11;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}